

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

iterator * __thiscall
fmt::v5::internal::
arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>
::operator()(iterator *__return_storage_ptr__,
            arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>
            *this,void *value)

{
  char *pcVar1;
  size_t sVar2;
  value_type vVar3;
  undefined7 uVar4;
  error_handler local_19;
  
  if (this->specs_ != (format_specs *)0x0) {
    check_pointer_type_spec<char,fmt::v5::internal::error_handler>
              ((this->specs_->super_core_format_specs).type,&local_19);
  }
  write_pointer(this,value);
  pcVar1 = (this->writer_).out_.super_truncating_iterator_base<char_*>.out_;
  sVar2 = (this->writer_).out_.super_truncating_iterator_base<char_*>.limit_;
  vVar3 = (this->writer_).out_.blackhole_;
  uVar4 = *(undefined7 *)&(this->writer_).out_.field_0x19;
  (__return_storage_ptr__->super_truncating_iterator_base<char_*>).count_ =
       (this->writer_).out_.super_truncating_iterator_base<char_*>.count_;
  __return_storage_ptr__->blackhole_ = vVar3;
  *(undefined7 *)&__return_storage_ptr__->field_0x19 = uVar4;
  (__return_storage_ptr__->super_truncating_iterator_base<char_*>).out_ = pcVar1;
  (__return_storage_ptr__->super_truncating_iterator_base<char_*>).limit_ = sVar2;
  return __return_storage_ptr__;
}

Assistant:

iterator operator()(const void *value) {
    if (specs_)
      check_pointer_type_spec(specs_->type, internal::error_handler());
    write_pointer(value);
    return out();
  }